

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::format<std::basic_string_view<char,std::char_traits<char>>>
                   (char *fmt,basic_string_view<char,_std::char_traits<char>_> *args)

{
  string *in_RDI;
  long in_FS_OFFSET;
  ostringstream oss;
  basic_string_view<char,_std::char_traits<char>_> *args_00;
  char *in_stack_fffffffffffffe58;
  ostream *in_stack_fffffffffffffe60;
  basic_string_view<char,_std::char_traits<char>_> local_180 [23];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args_00 = local_180;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)args_00);
  format<std::basic_string_view<char,std::char_traits<char>>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,args_00);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}